

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ParseHexV(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,UniValue *v,
         string_view name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  string *__str;
  UniValue *__return_storage_ptr___00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view str;
  string strHex;
  size_t local_78;
  char *local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_70 = name._M_str;
  local_78 = name._M_len;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  if (v->typ == VSTR) {
    __str = UniValue::get_str_abi_cxx11_(v);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_48,__str);
  }
  str._M_str = local_48._M_dataplus._M_p;
  str._M_len = local_48._M_string_length;
  bVar2 = IsHex(str);
  if (bVar2) {
    hex_str._M_str = local_48._M_dataplus._M_p;
    hex_str._M_len = local_48._M_string_length;
    ParseHex<unsigned_char>(__return_storage_ptr__,hex_str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  else {
    __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
    tinyformat::format<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              (&local_68,(tinyformat *)"%s must be hexadecimal string (not \'%s\')",
               (char *)&local_78,(basic_string_view<char,_std::char_traits<char>_> *)&local_48,in_R8
              );
    JSONRPCError(__return_storage_ptr___00,-8,&local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ParseHexV(const UniValue& v, std::string_view name)
{
    std::string strHex;
    if (v.isStr())
        strHex = v.get_str();
    if (!IsHex(strHex))
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("%s must be hexadecimal string (not '%s')", name, strHex));
    return ParseHex(strHex);
}